

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.h
# Opt level: O3

bool __thiscall ami_nvar_t::nvar_entry_t::_is_null_signature_rest(nvar_entry_t *this)

{
  pointer pcVar1;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (this->m_signature_rest)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + (this->m_signature_rest)._M_string_length);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return this->n_signature_rest;
}

Assistant:

bool _is_null_signature_rest() { signature_rest(); return n_signature_rest; }